

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O1

void vkt::clipping::anon_unknown_0::addClippingTests(TestCaseGroup *clippingTestsGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkPrimitiveTopology VVar2;
  TestContext *pTVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  long *plVar12;
  ulong *puVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 uVar14;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **value;
  uint uVar15;
  int iVar16;
  _Alloc_hider testFunc;
  LineOrientation arg0;
  char *__end;
  char *__end_3;
  long lVar17;
  uint uVar18;
  string mainGroupName;
  string caseName;
  string shaderGroupName;
  string local_2c0;
  char local_299;
  TestNode *local_298;
  uint local_28c;
  TestContext *local_288;
  long *local_280;
  undefined8 local_278;
  long local_270;
  undefined8 uStack_268;
  TestNode *local_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  anon_struct_24_3_c7e9beb3 *local_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  TestNode *local_1e8;
  long local_1e0;
  ulong local_1d8;
  pointer local_1d0;
  string local_1c8 [3];
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  pTVar3 = (clippingTestsGroup->super_TestNode).m_testCtx;
  local_1e8 = &clippingTestsGroup->super_TestNode;
  pTVar4 = (TestNode *)operator_new(0x70);
  local_288 = pTVar3;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pTVar3,"clip_volume","clipping with the clip volume");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,local_288,"inside","");
  lVar17 = 0;
  uVar14 = extraout_RDX;
  do {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar17);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (local_1c8,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar14);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"","");
    pTVar6 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar5->m_testCtx,NODETYPE_SELF_VALIDATE,local_1c8,&local_2c0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesInside,VVar2);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    uVar14 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_02;
    }
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x28);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,local_288,"outside","");
  lVar17 = 0;
  uVar14 = extraout_RDX_03;
  do {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar17);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (local_1c8,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar14);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"","");
    pTVar6 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar5->m_testCtx,NODETYPE_SELF_VALIDATE,local_1c8,&local_2c0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesOutside,VVar2);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    uVar14 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_06;
    }
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x28);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,local_288,"depth_clamp","");
  lVar17 = 0;
  uVar14 = extraout_RDX_07;
  do {
    VVar2 = *(VkPrimitiveTopology *)((long)addClippingTests::cases + lVar17);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (local_1c8,(drawutil *)(ulong)VVar2,(VkPrimitiveTopology)uVar14);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"","");
    arg0 = 0x3e4614;
    pTVar6 = (TestNode *)
             createFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
                       (pTVar5->m_testCtx,NODETYPE_SELF_VALIDATE,local_1c8,&local_2c0,
                        ClipVolume::initPrograms,ClipVolume::testPrimitivesDepthClamp,VVar2);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    uVar14 = extraout_RDX_08;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
      operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
      uVar14 = extraout_RDX_10;
    }
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x28);
  tcu::TestNode::addChild(pTVar4,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x70);
  paVar1 = &local_1c8[0].field_2;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,local_288,"clipped","");
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"large_points","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  pTVar3 = pTVar5->m_testCtx;
  pTVar6 = (TestNode *)operator_new(0x80);
  testFunc._M_p = local_2c0._M_dataplus._M_p;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar3,NODETYPE_SELF_VALIDATE,local_1c8[0]._M_dataplus._M_p,
             local_2c0._M_dataplus._M_p);
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d50e80;
  pTVar6[1]._vptr_TestNode = (_func_int **)ClipVolume::initProgramsPointSize;
  pTVar6[1].m_testCtx = (TestContext *)ClipVolume::testLargePoints;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  paVar10 = &local_2c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
  }
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"wide_lines_axis_aligned","");
  local_2c0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            ((TestCaseGroup *)pTVar5,local_1c8,&local_2c0,(Function)0x0,(Function)testFunc._M_p,arg0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
  }
  local_1c8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"wide_lines_diagonal","");
  local_2c0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            ((TestCaseGroup *)pTVar5,local_1c8,&local_2c0,(Function)&DAT_00000001,
             (Function)testFunc._M_p,arg0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1);
  }
  tcu::TestNode::addChild(pTVar4,pTVar5);
  tcu::TestNode::addChild(local_1e8,pTVar4);
  local_298 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_298,local_288,"user_defined","user-defined clip planes");
  lVar17 = 0;
  value = extraout_RDX_11;
  do {
    local_210 = addClippingTests::caseGroups + lVar17;
    local_238 = 0;
    local_1e0 = lVar17;
    do {
      de::toString<char_const*>(local_1c8,(de *)local_210,value);
      plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_2c0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2c0.field_2._8_8_ = plVar7[3];
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      }
      else {
        local_2c0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2c0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2c0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
        operator_delete(local_1c8[0]._M_dataplus._M_p,local_1c8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_260 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_260,local_288,local_2c0._M_dataplus._M_p,"");
      local_1d8 = (ulong)((int)local_238 == 1) << 0x20;
      local_28c = 0;
      do {
        local_280 = &local_270;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"vert","");
        uVar15 = local_28c & 1;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_280);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1c8[0].field_2._0_8_ = *psVar11;
          local_1c8[0].field_2._8_8_ = plVar7[3];
          local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
        }
        else {
          local_1c8[0].field_2._0_8_ = *psVar11;
          local_1c8[0]._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1c8[0]._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_230 = &local_220;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_220 = *plVar12;
          lStack_218 = plVar7[3];
        }
        else {
          local_220 = *plVar12;
          local_230 = (long *)*plVar7;
        }
        local_228 = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
          operator_delete(local_1c8[0]._M_dataplus._M_p,
                          local_1c8[0].field_2._M_allocated_capacity + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        pTVar4 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,local_288,(char *)local_230,"");
        uVar8 = 10;
        if (uVar15 == 0) {
          uVar8 = 3;
        }
        local_299 = local_210->useCullDistance;
        local_1d0 = (pointer)((ulong)(1 < local_28c) << 0x30 |
                             (ulong)uVar15 << 0x28 | uVar8 | local_1d8);
        lVar17 = 1;
        uVar15 = 7;
        do {
          uVar18 = 0;
          if (local_299 != '\0') {
            uVar18 = uVar15;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::ostream::operator<<(local_1c8,(int)lVar17);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
          if ((int)uVar18 < 1) {
            local_258 = &local_248;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::ostream::operator<<(local_1c8,uVar18);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0xb027fe);
            local_258 = &local_248;
            puVar13 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar13) {
              local_248 = *puVar13;
              lStack_240 = plVar7[3];
            }
            else {
              local_248 = *puVar13;
              local_258 = (ulong *)*plVar7;
            }
            local_250 = plVar7[1];
            *plVar7 = (long)puVar13;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
          }
          uVar8 = 0xf;
          if (local_208 != local_1f8) {
            uVar8 = local_1f8[0];
          }
          if (uVar8 < (ulong)(local_250 + local_200)) {
            uVar8 = 0xf;
            if (local_258 != &local_248) {
              uVar8 = local_248;
            }
            if (uVar8 < (ulong)(local_250 + local_200)) goto LAB_003e310a;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_208)
            ;
          }
          else {
LAB_003e310a:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_258);
          }
          local_280 = &local_270;
          plVar7 = puVar9 + 2;
          if ((long *)*puVar9 == plVar7) {
            local_270 = *plVar7;
            uStack_268 = puVar9[3];
          }
          else {
            local_270 = *plVar7;
            local_280 = (long *)*puVar9;
          }
          local_278 = puVar9[1];
          *puVar9 = plVar7;
          puVar9[1] = 0;
          *(undefined1 *)plVar7 = 0;
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if ((0 < (int)uVar18) && (local_50[0] != local_40)) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          if (local_208 != local_1f8) {
            operator_delete(local_208,local_1f8[0] + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1c8,local_210->description,(allocator<char> *)&local_208);
          pTVar3 = pTVar4->m_testCtx;
          pTVar5 = (TestNode *)operator_new(0x90);
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar5,pTVar3,NODETYPE_SELF_VALIDATE,(char *)local_280,
                     local_1c8[0]._M_dataplus._M_p);
          pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d50d40;
          pTVar5[1]._vptr_TestNode = (_func_int **)ClipDistance::initPrograms;
          pTVar5[1].m_testCtx = (TestContext *)ClipDistance::testClipDistance;
          pTVar5[1].m_name._M_dataplus._M_p = local_1d0;
          pTVar5[1].m_name._M_string_length = ((ulong)uVar18 << 0x20) + lVar17;
          tcu::TestNode::addChild(pTVar4,pTVar5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
            operator_delete(local_1c8[0]._M_dataplus._M_p,
                            local_1c8[0].field_2._M_allocated_capacity + 1);
          }
          if (local_280 != &local_270) {
            operator_delete(local_280,local_270 + 1);
          }
          lVar17 = lVar17 + 1;
          uVar15 = uVar15 - 1;
        } while (lVar17 != 9);
        tcu::TestNode::addChild(local_260,pTVar4);
        if (local_230 != &local_220) {
          operator_delete(local_230,local_220 + 1);
        }
        local_28c = local_28c + 1;
      } while (local_28c != 4);
      tcu::TestNode::addChild(local_298,local_260);
      value = extraout_RDX_12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        value = extraout_RDX_13;
      }
      iVar16 = (int)local_238;
      local_238 = (ulong)(iVar16 + 1);
    } while (iVar16 == 0);
    lVar17 = local_1e0 + 1;
    if (local_1e0 != 0) {
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar4,local_288,"complementarity","");
      iVar16 = 1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<(local_1c8,iVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,(char *)local_230,(allocator<char> *)&local_280);
        local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"","");
        pTVar5 = (TestNode *)
                 createFunctionCaseWithPrograms<int>
                           (pTVar4->m_testCtx,NODETYPE_SELF_VALIDATE,&local_2c0,local_1c8,
                            ClipDistanceComplementarity::initPrograms,
                            ClipDistanceComplementarity::testComplementarity,iVar16);
        tcu::TestNode::addChild(pTVar4,pTVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8[0]._M_dataplus._M_p != &local_1c8[0].field_2) {
          operator_delete(local_1c8[0]._M_dataplus._M_p,
                          local_1c8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,local_220 + 1);
        }
        pTVar5 = local_1e8;
        iVar16 = iVar16 + 1;
      } while (iVar16 != 9);
      tcu::TestNode::addChild(local_1e8,pTVar4);
      tcu::TestNode::addChild(pTVar5,local_298);
      return;
    }
  } while( true );
}

Assistant:

void addClippingTests (tcu::TestCaseGroup* clippingTestsGroup)
{
	tcu::TestContext& testCtx = clippingTestsGroup->getTestContext();

	// Clipping against the clip volume
	{
		using namespace ClipVolume;

		static const VkPrimitiveTopology cases[] =
		{
			VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
		};

		MovePtr<tcu::TestCaseGroup> clipVolumeGroup(new tcu::TestCaseGroup(testCtx, "clip_volume", "clipping with the clip volume"));

		// Fully inside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "inside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesInside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Fully outside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "outside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesOutside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Depth clamping
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "depth_clamp", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesDepthClamp, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Large points and wide lines
		{
			// \note For both points and lines, if an unsupported size/width is selected, the nearest supported size will be chosen.
			//       We do have to check for feature support though.

			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "clipped", ""));

			addFunctionCaseWithPrograms(group.get(), "large_points", "", initProgramsPointSize, testLargePoints);

			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_axis_aligned", "", initPrograms, testWideLines, LINE_ORIENTATION_AXIS_ALIGNED);
			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_diagonal",	 "", initPrograms, testWideLines, LINE_ORIENTATION_DIAGONAL);

			clipVolumeGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipVolumeGroup.release());
	}

	// User-defined clip planes
	{
		MovePtr<tcu::TestCaseGroup> clipDistanceGroup(new tcu::TestCaseGroup(testCtx, "user_defined", "user-defined clip planes"));

		// ClipDistance, CullDistance and maxCombinedClipAndCullDistances usage
		{
			using namespace ClipDistance;

			static const struct
			{
				const char* const	groupName;
				const char* const	description;
				bool				useCullDistance;
			} caseGroups[] =
			{
				{ "clip_distance",		"use ClipDistance",										false },
				{ "clip_cull_distance",	"use ClipDistance and CullDistance at the same time",	true  },
			};

			const deUint32 flagTessellation = 1u << 0;
			const deUint32 flagGeometry		= 1u << 1;

			for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(caseGroups); ++groupNdx)
			for (int indexingMode = 0; indexingMode < 2; ++indexingMode)
			{
				const bool			dynamicIndexing	= (indexingMode == 1);
				const std::string	mainGroupName	= de::toString(caseGroups[groupNdx].groupName) + (dynamicIndexing ? "_dynamic_index" : "");

				MovePtr<tcu::TestCaseGroup>	mainGroup(new tcu::TestCaseGroup(testCtx, mainGroupName.c_str(), ""));

				for (deUint32 shaderMask = 0u; shaderMask <= (flagTessellation | flagGeometry); ++shaderMask)
				{
					const bool			useTessellation	= (shaderMask & flagTessellation) != 0;
					const bool			useGeometry		= (shaderMask & flagGeometry) != 0;
					const std::string	shaderGroupName	= std::string("vert") + (useTessellation ? "_tess" : "") + (useGeometry ? "_geom" : "");

					MovePtr<tcu::TestCaseGroup>	shaderGroup(new tcu::TestCaseGroup(testCtx, shaderGroupName.c_str(), ""));

					for (int numClipPlanes = 1; numClipPlanes <= MAX_CLIP_DISTANCES; ++numClipPlanes)
					{
						const int					numCullPlanes	= (caseGroups[groupNdx].useCullDistance
																		? std::min(static_cast<int>(MAX_CULL_DISTANCES), MAX_COMBINED_CLIP_AND_CULL_DISTANCES - numClipPlanes)
																		: 0);
						const std::string			caseName		= de::toString(numClipPlanes) + (numCullPlanes > 0 ? "_" + de::toString(numCullPlanes) : "");
						const VkPrimitiveTopology	topology		= (useTessellation ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

						addFunctionCaseWithPrograms<CaseDefinition>(
							shaderGroup.get(), caseName, caseGroups[groupNdx].description, initPrograms, testClipDistance,
							CaseDefinition(topology, numClipPlanes, numCullPlanes, useTessellation, useGeometry, dynamicIndexing));
					}
					mainGroup->addChild(shaderGroup.release());
				}
				clipDistanceGroup->addChild(mainGroup.release());
			}
		}

		// Complementarity criterion (i.e. clipped and not clipped areas must add up to a complete primitive with no holes nor overlap)
		{
			using namespace ClipDistanceComplementarity;

			MovePtr<tcu::TestCaseGroup>	group(new tcu::TestCaseGroup(testCtx, "complementarity", ""));

			for (int numClipDistances = 1; numClipDistances <= MAX_CLIP_DISTANCES; ++numClipDistances)
				addFunctionCaseWithPrograms<int>(group.get(), de::toString(numClipDistances).c_str(), "", initPrograms, testComplementarity, numClipDistances);

			clippingTestsGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipDistanceGroup.release());
	}
}